

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

int __thiscall QTimer::remainingTime(QTimer *this)

{
  QObjectData *pQVar1;
  int iVar2;
  QAbstractEventDispatcher *this_00;
  Duration DVar3;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if ((int)pQVar1[1].children.d.size < 1) {
    iVar2 = -1;
  }
  else {
    this_00 = (QAbstractEventDispatcher *)QAbstractEventDispatcher::instance((QThread *)0x0);
    DVar3 = QAbstractEventDispatcher::remainingTime(this_00,(TimerId)pQVar1[1].children.d.size);
    iVar2 = (uint)((DVar3.__r / 1000000) * 1000000 < DVar3.__r) + (int)(DVar3.__r / 1000000);
  }
  return iVar2;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }